

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

int __thiscall
kratos::SequentialStmtBlock::clone
          (SequentialStmtBlock *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _func_int **pp_Var1;
  pointer ppVar2;
  StmtBlock *local_48;
  pointer local_40;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> local_38;
  
  std::__shared_ptr<kratos::SequentialStmtBlock,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::SequentialStmtBlock>>
            ((__shared_ptr<kratos::SequentialStmtBlock,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (allocator<kratos::SequentialStmtBlock> *)&local_38);
  std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::vector
            (&local_38,
             (vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *)(__fn + 0xe0));
  pp_Var1 = local_48[1].super_Stmt.super_IRNode._vptr_IRNode;
  ppVar2 = local_48[1].super_Stmt.super_IRNode.fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48[1].super_Stmt.super_IRNode._vptr_IRNode =
       (_func_int **)
       local_38.super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48[1].super_Stmt.super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_38.
                super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_48[1].super_Stmt.super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_38.
                super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pp_Var1 != (_func_int **)0x0) {
    operator_delete(pp_Var1,(long)ppVar2 - (long)pp_Var1);
    if (local_38.super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  StmtBlock::clone_block((StmtBlock *)__fn,local_48);
  (this->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)local_48;
  (this->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_40;
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> SequentialStmtBlock::clone() const {
    auto stmt = std::make_shared<SequentialStmtBlock>();
    stmt->conditions_ = std::vector(conditions_);
    clone_block(stmt.get());
    return stmt;
}